

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O2

void m256v_permute_rows(m256v *M,int *rowperm)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  size_t sVar4;
  int i;
  ulong uVar5;
  undefined8 uStack_60;
  uint8_t auStack_58 [8];
  undefined1 local_50 [8];
  m256v rowbuf_mat;
  
  uVar1 = M->n_row;
  uVar5 = (ulong)uVar1;
  rowbuf_mat.e = auStack_58 + -(uVar5 + 0xf & 0xfffffffffffffff0);
  uVar2 = 0;
  uVar3 = 0;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    rowbuf_mat.e[uVar2] = '\0';
  }
  local_50._4_4_ = M->n_col;
  rowbuf_mat._0_8_ = SEXT48((int)local_50._4_4_);
  sVar4 = (long)rowbuf_mat.e - ((ulong)(uint)local_50._4_4_ + 0xf & 0xfffffffffffffff0);
  local_50._0_4_ = 1;
  rowbuf_mat.rstride = sVar4;
  for (uVar2 = 0; (long)uVar2 < (long)(int)uVar5; uVar2 = uVar2 + 1) {
    if (rowbuf_mat.e[uVar2] == '\0') {
      if (uVar2 == (uint)rowperm[uVar2]) {
        rowbuf_mat.e[uVar2] = '\x01';
      }
      else {
        *(undefined8 *)(sVar4 - 8) = 0x101cd6;
        m256v_copy_row(M,(int)uVar2,(m256v *)local_50,0);
        uVar3 = uVar2 & 0xffffffff;
        uVar5 = uVar2;
        while( true ) {
          uVar1 = rowperm[uVar5];
          if (uVar2 == uVar1) break;
          uVar5 = (ulong)(int)uVar1;
          rowbuf_mat.e[uVar5] = '\x01';
          *(undefined8 *)(sVar4 - 8) = 0x101cfc;
          m256v_copy_row(M,uVar1,M,(int)uVar3);
          uVar3 = (ulong)uVar1;
        }
        rowbuf_mat.e[uVar2] = '\x01';
        *(undefined8 *)(sVar4 - 8) = 0x101d1e;
        m256v_copy_row((m256v *)local_50,0,M,(int)uVar3);
        uVar5 = (ulong)(uint)M->n_row;
      }
    }
  }
  return;
}

Assistant:

void MV_GEN_N(_permute_rows)(MV_GEN_TYPE* M, const int* rowperm)
{
	char visited[M->n_row];
	for (int i = 0; i < M->n_row; ++i)
		visited[i] = 0;

	MV_GEN_N(_Def)(rowbuf_mat, rowbuf, 1, M->n_col)
	for (int i = 0; i < M->n_row; ++i) {
		if (visited[i])
			continue;
		if (rowperm[i] == i) {
			/* Simple case of a self-cycle; do nothing. */
			visited[i] = 1;
			continue;
		}

		/* Otherwise we need to shuffle things around. */
		MV_GEN_N(_copy_row)(M, i, &rowbuf_mat, 0);
		int e = i, e_next = rowperm[i];
		while (e_next != i) {
			assert(!visited[e_next]);
			visited[e_next] = 1;
			MV_GEN_N(_copy_row)(M, e_next, M, e);

			/* Advance in the cycle */
			e = e_next;
			e_next = rowperm[e_next];
		}
		visited[i] = 1;
		MV_GEN_N(_copy_row)(&rowbuf_mat, 0, M, e);
	}
}